

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# brake.hpp
# Opt level: O0

void __thiscall
ruckig::BrakeProfile::finalize_second_order(BrakeProfile *this,double *ps,double *vs,double *as)

{
  value_type_conflict2 vVar1;
  double t;
  double p0;
  double v0;
  reference pvVar2;
  tuple<double_&,_double_&,_double_&> local_58;
  tuple<double,_double,_double> local_40;
  double *local_28;
  double *as_local;
  double *vs_local;
  double *ps_local;
  BrakeProfile *this_local;
  
  local_28 = as;
  as_local = vs;
  vs_local = ps;
  ps_local = &this->duration;
  pvVar2 = std::array<double,_2UL>::operator[](&this->t,0);
  if (0.0 < *pvVar2) {
    pvVar2 = std::array<double,_2UL>::operator[](&this->t,0);
    this->duration = *pvVar2;
    vVar1 = *vs_local;
    pvVar2 = std::array<double,_2UL>::operator[](&this->p,0);
    *pvVar2 = vVar1;
    vVar1 = *as_local;
    pvVar2 = std::array<double,_2UL>::operator[](&this->v,0);
    *pvVar2 = vVar1;
    pvVar2 = std::array<double,_2UL>::operator[](&this->t,0);
    t = *pvVar2;
    p0 = *vs_local;
    v0 = *as_local;
    pvVar2 = std::array<double,_2UL>::operator[](&this->a,0);
    integrate(&local_40,t,p0,v0,*pvVar2,0.0);
    std::tie<double,double,double>(&local_58,vs_local,as_local,local_28);
    std::tuple<double&,double&,double&>::operator=
              ((tuple<double&,double&,double&> *)&local_58,&local_40);
  }
  else {
    this->duration = 0.0;
  }
  return;
}

Assistant:

void finalize_second_order(double& ps, double& vs, double& as) {
        if (t[0] <= 0.0) {
            duration = 0.0;
            return;
        }

        duration = t[0];
        p[0] = ps;
        v[0] = vs;
        std::tie(ps, vs, as) = integrate(t[0], ps, vs, a[0], 0.0);
    }